

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_id.cc
# Opt level: O0

int MipsCpuCaps(char *cpuinfo_name)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  int iVar7;
  FILE *__stream;
  char *pcVar8;
  char *in_RDI;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  FILE *f;
  int flag;
  char cpuinfo_line [512];
  uint local_21c;
  char local_218;
  char cStack_217;
  char cStack_216;
  char cStack_215;
  char cStack_214;
  char cStack_213;
  char cStack_212;
  char cStack_211;
  char cStack_210;
  char cStack_20f;
  char cStack_20e;
  char cStack_20d;
  char cStack_20c;
  char cStack_20b;
  char cStack_20a;
  char cStack_209;
  uint local_4;
  
  local_21c = 0;
  __stream = fopen64(in_RDI,"r");
  if (__stream == (FILE *)0x0) {
    local_4 = 0;
  }
  else {
    do {
      pcVar8 = fgets(&local_218,0x1ff,__stream);
      if (pcVar8 == (char *)0x0) goto LAB_0012922b;
      iVar7 = memcmp(&local_218,"cpu model",9);
      if (iVar7 == 0) {
        pcVar8 = strstr(&local_218,"Loongson-3");
        if (pcVar8 == (char *)0x0) {
          pcVar8 = strstr(&local_218,"Loongson-2K");
          if (pcVar8 != (char *)0x0) {
            local_21c = 0xc00000;
          }
        }
        else {
          local_21c = local_21c | 0x800000;
        }
      }
      cVar9 = -(cStack_216 == 'E');
      cVar10 = -(cStack_215 == 's');
      cVar11 = -(cStack_214 == ' ');
      cVar12 = -(cStack_213 == 'i');
      cVar13 = -(cStack_212 == 'm');
      cVar14 = -(cStack_211 == 'p');
      cVar15 = -(cStack_210 == 'l');
      cVar16 = -(cStack_20f == 'e');
      cVar17 = -(cStack_20e == 'm');
      cVar18 = -(cStack_20d == 'e');
      cVar19 = -(cStack_20c == 'n');
      cVar20 = -(cStack_20b == 't');
      cVar21 = -(cStack_20a == 'e');
      bVar22 = -(cStack_209 == 'd');
      auVar1[1] = -(cStack_217 == 'S');
      auVar1[0] = -(local_218 == 'A');
      auVar1[2] = cVar9;
      auVar1[3] = cVar10;
      auVar1[4] = cVar11;
      auVar1[5] = cVar12;
      auVar1[6] = cVar13;
      auVar1[7] = cVar14;
      auVar1[8] = cVar15;
      auVar1[9] = cVar16;
      auVar1[10] = cVar17;
      auVar1[0xb] = cVar18;
      auVar1[0xc] = cVar19;
      auVar1[0xd] = cVar20;
      auVar1[0xe] = cVar21;
      auVar1[0xf] = bVar22;
      auVar2[1] = -(cStack_217 == 'S');
      auVar2[0] = -(local_218 == 'A');
      auVar2[2] = cVar9;
      auVar2[3] = cVar10;
      auVar2[4] = cVar11;
      auVar2[5] = cVar12;
      auVar2[6] = cVar13;
      auVar2[7] = cVar14;
      auVar2[8] = cVar15;
      auVar2[9] = cVar16;
      auVar2[10] = cVar17;
      auVar2[0xb] = cVar18;
      auVar2[0xc] = cVar19;
      auVar2[0xd] = cVar20;
      auVar2[0xe] = cVar21;
      auVar2[0xf] = bVar22;
      auVar6[1] = cVar10;
      auVar6[0] = cVar9;
      auVar6[2] = cVar11;
      auVar6[3] = cVar12;
      auVar6[4] = cVar13;
      auVar6[5] = cVar14;
      auVar6[6] = cVar15;
      auVar6[7] = cVar16;
      auVar6[8] = cVar17;
      auVar6[9] = cVar18;
      auVar6[10] = cVar19;
      auVar6[0xb] = cVar20;
      auVar6[0xc] = cVar21;
      auVar6[0xd] = bVar22;
      auVar5[1] = cVar11;
      auVar5[0] = cVar10;
      auVar5[2] = cVar12;
      auVar5[3] = cVar13;
      auVar5[4] = cVar14;
      auVar5[5] = cVar15;
      auVar5[6] = cVar16;
      auVar5[7] = cVar17;
      auVar5[8] = cVar18;
      auVar5[9] = cVar19;
      auVar5[10] = cVar20;
      auVar5[0xb] = cVar21;
      auVar5[0xc] = bVar22;
      auVar4[1] = cVar12;
      auVar4[0] = cVar11;
      auVar4[2] = cVar13;
      auVar4[3] = cVar14;
      auVar4[4] = cVar15;
      auVar4[5] = cVar16;
      auVar4[6] = cVar17;
      auVar4[7] = cVar18;
      auVar4[8] = cVar19;
      auVar4[9] = cVar20;
      auVar4[10] = cVar21;
      auVar4[0xb] = bVar22;
      auVar3[1] = cVar13;
      auVar3[0] = cVar12;
      auVar3[2] = cVar14;
      auVar3[3] = cVar15;
      auVar3[4] = cVar16;
      auVar3[5] = cVar17;
      auVar3[6] = cVar18;
      auVar3[7] = cVar19;
      auVar3[8] = cVar20;
      auVar3[9] = cVar21;
      auVar3[10] = bVar22;
    } while ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(bVar22,CONCAT18(cVar21,CONCAT17(cVar20,CONCAT16(
                                                  cVar19,CONCAT15(cVar18,CONCAT14(cVar17,CONCAT13(
                                                  cVar16,CONCAT12(cVar15,CONCAT11(cVar14,cVar13)))))
                                                  )))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(bVar22,CONCAT17(cVar21,CONCAT16(cVar20,CONCAT15(
                                                  cVar19,CONCAT14(cVar18,CONCAT13(cVar17,CONCAT12(
                                                  cVar16,CONCAT11(cVar15,cVar14)))))))) >> 7) & 1)
                      << 7 | (ushort)(bVar22 >> 7) << 0xf) != 0xffff);
    pcVar8 = strstr(&local_218,"loongson-mmi");
    if ((pcVar8 != (char *)0x0) &&
       (pcVar8 = strstr(&local_218,"loongson-ext"), pcVar8 != (char *)0x0)) {
      local_21c = local_21c | 0x800000;
    }
    pcVar8 = strstr(&local_218,"msa");
    if (pcVar8 != (char *)0x0) {
      local_21c = local_21c | 0x400000;
    }
LAB_0012922b:
    fclose(__stream);
    local_4 = local_21c;
  }
  return local_4;
}

Assistant:

LIBYUV_API SAFEBUFFERS int MipsCpuCaps(const char* cpuinfo_name) {
  char cpuinfo_line[512];
  int flag = 0x0;
  FILE* f = fopen(cpuinfo_name, "r");
  if (!f) {
    // Assume nothing if /proc/cpuinfo is unavailable.
    // This will occur for Chrome sandbox for Pepper or Render process.
    return 0;
  }
  while (fgets(cpuinfo_line, sizeof(cpuinfo_line) - 1, f)) {
    if (memcmp(cpuinfo_line, "cpu model", 9) == 0) {
      // Workaround early kernel without mmi in ASEs line.
      if (strstr(cpuinfo_line, "Loongson-3")) {
        flag |= kCpuHasMMI;
      } else if (strstr(cpuinfo_line, "Loongson-2K")) {
        flag |= kCpuHasMMI | kCpuHasMSA;
      }
    }
    if (memcmp(cpuinfo_line, "ASEs implemented", 16) == 0) {
      if (strstr(cpuinfo_line, "loongson-mmi") &&
          strstr(cpuinfo_line, "loongson-ext")) {
        flag |= kCpuHasMMI;
      }
      if (strstr(cpuinfo_line, "msa")) {
        flag |= kCpuHasMSA;
      }
      // ASEs is the last line, so we can break here.
      break;
    }
  }
  fclose(f);
  return flag;
}